

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O1

void __thiscall
duckdb::CSVSniffer::AnalyzeDialectCandidate
          (CSVSniffer *this,
          unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
          *scanner,idx_t *rows_read,idx_t *best_consistent_rows,idx_t *prev_padding_count,
          idx_t *min_ignored_rows)

{
  idx_t *piVar1;
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
  *this_00;
  CSVReaderOptions *pCVar2;
  ulong uVar3;
  ulong uVar4;
  vector<duckdb::LogicalType,_true> *pvVar5;
  pointer puVar6;
  _Head_base<0UL,_duckdb::ColumnCountScanner_*,_false> _Var7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  pointer pCVar14;
  undefined4 extraout_var;
  CSVErrorHandler *pCVar15;
  reference pvVar16;
  ulong uVar17;
  reference pvVar18;
  CSVStateMachine *pCVar19;
  ulong uVar20;
  idx_t iVar21;
  ulong uVar22;
  SetColumns *this_02;
  idx_t iVar23;
  pointer *__ptr;
  size_type __n;
  pointer puVar24;
  unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
  *candidate;
  vector<duckdb::ColumnCount,_true> *this_03;
  pointer puVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
  *__range4;
  ulong local_158;
  long local_148;
  size_type local_138;
  ulong local_128;
  long local_108;
  ulong local_f0;
  size_type local_e8;
  long local_e0;
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  char local_90 [24];
  idx_t iStack_78;
  _Alloc_hider local_70;
  char local_60 [16];
  idx_t local_50;
  idx_t iStack_48;
  idx_t local_40;
  optional_idx oStack_38;
  ColumnCountResult *this_01;
  
  pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
            ::operator->(scanner);
  iVar13 = (*(pCVar14->super_BaseScanner)._vptr_BaseScanner[2])(pCVar14);
  this_01 = (ColumnCountResult *)CONCAT44(extraout_var,iVar13);
  if (this_01->error == true) {
    pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
              ::operator->(scanner);
    pCVar15 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                        (&(pCVar14->super_BaseScanner).error_handler);
    bVar8 = CSVErrorHandler::HasError(pCVar15,MAXIMUM_LINE_SIZE);
    if (!bVar8) {
      this->all_fail_max_line_size = false;
      return;
    }
    pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
              ::operator->(scanner);
    pCVar15 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                        (&(pCVar14->super_BaseScanner).error_handler);
    CSVErrorHandler::GetFirstError((CSVError *)local_c0,pCVar15,MAXIMUM_LINE_SIZE);
    ::std::__cxx11::string::operator=((string *)&this->line_error,(string *)local_c0);
    ::std::__cxx11::string::operator=
              ((string *)&(this->line_error).full_error_message,(string *)&local_a0);
    (this->line_error).type = local_90[0x10];
    (this->line_error).field_0x41 = local_90[0x11];
    (this->line_error).field_0x42 = local_90[0x12];
    (this->line_error).field_0x43 = local_90[0x13];
    (this->line_error).field_0x44 = local_90[0x14];
    (this->line_error).field_0x45 = local_90[0x15];
    (this->line_error).field_0x46 = local_90[0x16];
    (this->line_error).field_0x47 = local_90[0x17];
    (this->line_error).column_idx = iStack_78;
    ::std::__cxx11::string::operator=((string *)&(this->line_error).csv_row,(string *)&local_70);
    (this->line_error).row_byte_position = local_40;
    (this->line_error).byte_position.index = oStack_38.index;
    (this->line_error).error_info.boundary_idx = local_50;
    (this->line_error).error_info.lines_in_batch = iStack_48;
    if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p);
    }
    if (local_a0._M_p != local_90) {
      operator_delete(local_a0._M_p);
    }
    if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
      return;
    }
    operator_delete((void *)local_c0._0_8_);
    return;
  }
  this->all_fail_max_line_size = false;
  if (this_01->result_position == 0) {
    local_158 = 1;
  }
  else {
    pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](&this_01->column_counts,0);
    local_158 = pvVar16->number_of_columns;
  }
  bVar8 = (this->options->ignore_errors).value;
  if (bVar8 == true) {
    bVar9 = this->options->null_padding ^ 1;
  }
  else {
    bVar9 = 0;
  }
  if (bVar9 != 0) {
    local_158 = ColumnCountResult::GetMostFrequentColumnCount(this_01);
  }
  bVar28 = this->options->null_padding;
  if (*rows_read < this_01->result_position) {
    *rows_read = this_01->result_position;
  }
  this_02 = &this->set_columns;
  this_03 = &this_01->column_counts;
  pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,0);
  bVar10 = SetColumns::IsCandidateUnacceptable
                     (this_02,local_158,bVar28,bVar8,pvVar16->last_value_always_empty);
  if (bVar10) {
    uVar17 = this->max_columns_found_error;
    if (this->max_columns_found_error < local_158) {
      uVar17 = local_158;
    }
    this->max_columns_found_error = uVar17;
    return;
  }
  if (this_01->result_position == 0) {
    local_f0 = 0;
    local_108 = 0;
    local_128 = 0;
    local_148 = 0;
    local_e0 = 0;
    local_138 = 0;
  }
  else {
    local_138 = 0;
    local_e0 = 0;
    local_148 = 0;
    local_128 = 0;
    local_108 = 0;
    local_f0 = 0;
    bVar10 = false;
    local_e8 = 0;
    __n = 0;
    do {
      pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
      iVar21 = pvVar16->number_of_columns;
      bVar11 = this->options->null_padding;
      pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
      bVar11 = SetColumns::IsCandidateUnacceptable
                         (this_02,iVar21,bVar11,bVar8,pvVar16->last_value_always_empty);
      pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
      if (bVar11) {
        uVar17 = this->max_columns_found_error;
        if (uVar17 < pvVar16->number_of_columns) {
          pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
          uVar17 = pvVar16->number_of_columns;
        }
        this->max_columns_found_error = uVar17;
        return;
      }
      if (pvVar16->is_comment == true) {
        local_108 = local_108 + 1;
      }
      else {
        pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
        if (pvVar16->last_value_always_empty == true) {
          pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
          iVar21 = pvVar16->number_of_columns;
          pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,local_e8);
          if (iVar21 != pvVar16->number_of_columns + 1) goto LAB_00b984a8;
LAB_00b98556:
          local_148 = local_148 + 1;
        }
        else {
LAB_00b984a8:
          pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
          if ((((local_158 < pvVar16->number_of_columns) &&
               (((this->options->dialect_options).skip_rows.set_by_user & local_108 == 0) == 0)) &&
              ((pvVar5 = this_02->types, pvVar5 == (vector<duckdb::LogicalType,_true> *)0x0 ||
               (((pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 (pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish || (this->options->null_padding == true))
               )))) && ((bVar10 & bVar9) == 0)) {
            if (bVar10 == false) {
              (((this_01->super_ScannerResult).state_machine)->dialect_options).rows_until_header =
                   __n;
              bVar10 = true;
            }
            pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
            local_158 = pvVar16->number_of_columns;
            local_e0 = __n - local_108;
            local_148 = 1;
            local_128 = 0;
            local_138 = __n;
            local_e8 = __n;
          }
          else {
            pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
            if ((~bVar9 & pvVar16->number_of_columns != local_158) == 0) {
              if (!bVar10) {
                (((this_01->super_ScannerResult).state_machine)->dialect_options).rows_until_header
                     = __n;
                bVar10 = true;
                local_138 = __n;
              }
              pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
              local_f0 = local_f0 + (pvVar16->number_of_columns != local_158);
              goto LAB_00b98556;
            }
            pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,__n);
            local_128 = (local_128 + 1) - (ulong)(local_158 < pvVar16->number_of_columns);
          }
        }
      }
      __n = __n + 1;
    } while (__n < this_01->result_position);
  }
  pCVar19 = (this_01->super_ScannerResult).state_machine;
  pCVar2 = pCVar19->options;
  if ((pCVar2->dialect_options).skip_rows.set_by_user == true) {
    piVar1 = &(pCVar19->dialect_options).rows_until_header;
    *piVar1 = *piVar1 + (pCVar2->dialect_options).skip_rows.value;
  }
  uVar22 = local_148 + local_128;
  uVar17 = this->max_columns_found;
  uVar3 = *best_consistent_rows;
  bVar11 = true;
  bVar10 = true;
  if (uVar17 < 2) {
    bVar10 = local_158 <=
             ((long)(this->candidates).
                    super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->candidates).
                    super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * uVar17;
  }
  uVar4 = *prev_padding_count;
  iVar21 = this_01->result_position;
  this_00 = &this->candidates;
  if ((this->candidates).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->candidates).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar18 = vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
              ::front(this_00);
    pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
              ::operator->(pvVar18);
    pCVar19 = BaseScanner::GetStateMachine(&pCVar14->super_BaseScanner);
    bVar11 = (pCVar19->dialect_options).skip_rows.value < local_138;
  }
  bVar12 = AreCommentsAcceptable
                     (this_01,local_158,
                      (this->options->dialect_options).state_machine_options.comment.set_by_user);
  pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
            ::operator->(scanner);
  if ((pCVar14->super_BaseScanner).ever_quoted == true) {
    bVar26 = (((this_01->super_ScannerResult).state_machine)->dialect_options).state_machine_options
             .quote.value != '\0';
  }
  else {
    bVar26 = false;
  }
  pvVar5 = this_02->types;
  if (pvVar5 == (vector<duckdb::LogicalType,_true> *)0x0) {
    uVar20 = 0;
  }
  else {
    uVar20 = ((long)(pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  }
  bVar27 = true;
  if (local_158 != uVar20) {
    if (pvVar5 == (vector<duckdb::LogicalType,_true> *)0x0) {
      uVar20 = 1;
    }
    else {
      uVar20 = ((long)(pvVar5->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar5->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1;
    }
    if (((local_158 != uVar20) ||
        (pvVar16 = vector<duckdb::ColumnCount,_true>::operator[](this_03,0),
        pvVar16->last_value_always_empty == false)) &&
       (pvVar5 = this_02->types, pvVar5 != (vector<duckdb::LogicalType,_true> *)0x0)) {
      bVar27 = (pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start ==
               (pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
    }
  }
  uVar20 = this->max_columns_found_error;
  if (this->max_columns_found_error < local_158) {
    uVar20 = local_158;
  }
  this->max_columns_found_error = uVar20;
  if (!bVar27) {
    return;
  }
  iVar23 = local_e0 + local_108 + uVar22;
  bVar9 = bVar28 | local_128 == 0;
  if (iVar23 == iVar21) {
LAB_00b98889:
    if ((bool)(bVar10 & ((uVar22 != uVar3 || local_158 <= uVar17) &&
                         (uVar22 <= uVar3 || local_158 < uVar17) || uVar4 < local_128))) {
      if ((bVar12 & ((local_128 < uVar4 && 1 < local_158) | bVar26) & bVar9) != 0) {
LAB_00b9899f:
        if ((((this->candidates).
              super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->candidates).
              super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) &&
            (pvVar5 = this_02->types, pvVar5 != (vector<duckdb::LogicalType,_true> *)0x0)) &&
           ((pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          if (pvVar5 == (vector<duckdb::LogicalType,_true> *)0x0) {
            iVar21 = 0;
          }
          else {
            iVar21 = ((long)(pvVar5->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar5->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          }
          if ((this->max_columns_found == iVar21) && (uVar22 <= *best_consistent_rows)) {
            pvVar18 = vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
                      ::front(this_00);
            pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                      ::operator->(pvVar18);
            if ((pCVar14->super_BaseScanner).ever_quoted != false) {
              return;
            }
            pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                      ::operator->(scanner);
            if ((pCVar14->super_BaseScanner).ever_quoted != true) {
              return;
            }
          }
        }
        pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                  ::operator->(scanner);
        pCVar19 = BaseScanner::GetStateMachine(&pCVar14->super_BaseScanner);
        if ((this->candidates).
            super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->candidates).
            super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar18 = vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
                    ::front(this_00);
          pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                    ::operator->(pvVar18);
          if ((pCVar14->super_BaseScanner).ever_quoted == true) {
            pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                      ::operator->(scanner);
            if ((pCVar14->super_BaseScanner).ever_quoted != true) {
              return;
            }
            pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                      ::operator->(scanner);
            if ((pCVar14->super_BaseScanner).ever_escaped == false) {
              pvVar18 = vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
                        ::front(this_00);
              pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                        ::operator->(pvVar18);
              if (((pCVar14->super_BaseScanner).ever_escaped == true) &&
                 ((pCVar19->dialect_options).state_machine_options.strict_mode.value != false)) {
                return;
              }
            }
            if ((*best_consistent_rows == uVar22) && (this->max_columns_found <= local_158)) {
              (pCVar19->dialect_options).num_cols = local_158;
              ::std::
              vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>>
                          *)this_00,scanner);
              this->max_columns_found = local_158;
              return;
            }
          }
        }
        uVar17 = this->max_columns_found;
        if ((uVar17 == local_158) && (*min_ignored_rows < local_f0)) {
          return;
        }
        if ((((1 < uVar17) && (uVar17 < local_158)) && (uVar22 < *best_consistent_rows >> 1)) &&
           (this->options->null_padding != false)) {
          return;
        }
        if ((bVar26 & local_158 < uVar17) == 1) {
          pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                    ::operator->(scanner);
          if (((pCVar14->super_BaseScanner).ever_escaped == true) &&
             ((pCVar19->dialect_options).state_machine_options.strict_mode.value == true)) {
            puVar6 = (this->candidates).
                     super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar25 = (this->candidates).
                           super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar6;
                puVar25 = puVar25 + 1) {
              pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                        ::operator->(puVar25);
              if (((pCVar14->super_BaseScanner).ever_quoted == true) &&
                 (pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                            ::operator->(puVar25),
                 (pCVar14->super_BaseScanner).ever_escaped != false)) {
                return;
              }
            }
          }
          else {
            puVar6 = (this->candidates).
                     super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar25 = (this->candidates).
                           super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar6;
                puVar25 = puVar25 + 1) {
              pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                        ::operator->(puVar25);
              if ((pCVar14->super_BaseScanner).ever_quoted != false) {
                return;
              }
            }
          }
        }
        *best_consistent_rows = uVar22;
        this->max_columns_found = local_158;
        *prev_padding_count = local_128;
        *min_ignored_rows = local_f0;
        pCVar2 = this->options;
        if ((pCVar2->dialect_options).skip_rows.set_by_user == true) {
          if (((local_138 != 0) && (pCVar2->null_padding == false)) &&
             ((local_108 != 0 | (pCVar2->ignore_errors).value) != 1)) {
            return;
          }
          local_138 = (pCVar2->dialect_options).skip_rows.value;
LAB_00b98cd5:
          (pCVar19->dialect_options).skip_rows.set_by_user = false;
          (pCVar19->dialect_options).skip_rows.value = local_138;
        }
        else if (pCVar2->null_padding == false) goto LAB_00b98cd5;
        puVar25 = (this->candidates).
                  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar6 = (this->candidates).
                 super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar24 = puVar25;
        if (puVar6 != puVar25) {
          do {
            _Var7._M_head_impl =
                 (puVar24->
                 super_unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ColumnCountScanner_*,_std::default_delete<duckdb::ColumnCountScanner>_>
                 .super__Head_base<0UL,_duckdb::ColumnCountScanner_*,_false>._M_head_impl;
            if (_Var7._M_head_impl != (ColumnCountScanner *)0x0) {
              (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseScanner + 8))();
            }
            (puVar24->
            super_unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnCountScanner_*,_std::default_delete<duckdb::ColumnCountScanner>_>
            .super__Head_base<0UL,_duckdb::ColumnCountScanner_*,_false>._M_head_impl =
                 (ColumnCountScanner *)0x0;
            puVar24 = puVar24 + 1;
          } while (puVar24 != puVar6);
          (this->candidates).
          super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar25;
        }
        (pCVar19->dialect_options).num_cols = local_158;
        this->lines_sniffed = this_01->result_position;
        goto LAB_00b98d42;
      }
    }
    else if ((bVar9 & bVar12) == 1) goto LAB_00b9899f;
  }
  else {
    pvVar5 = this_02->types;
    if (pvVar5 == (vector<duckdb::LogicalType,_true> *)0x0) {
      bVar28 = true;
    }
    else {
      bVar28 = (pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start ==
               (pvVar5->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
    }
    if ((!bVar28) && (bVar8 != false)) goto LAB_00b98889;
  }
  if ((((((bVar27 != true || local_158 < 2) || uVar22 < 2) || bVar11) || (iVar23 != iVar21)) ||
      ((uVar4 < local_128 || ((bVar9 != 1 || (local_158 != this->max_columns_found)))))) ||
     (!bVar12)) {
    return;
  }
  pCVar14 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
            ::operator->(scanner);
  pCVar19 = BaseScanner::GetStateMachine(&pCVar14->super_BaseScanner);
  pCVar2 = this->options;
  if ((pCVar2->dialect_options).skip_rows.set_by_user == true) {
    if (((local_138 != 0) && (pCVar2->null_padding == false)) &&
       ((pCVar2->ignore_errors).value != true)) {
      return;
    }
    local_138 = (pCVar2->dialect_options).skip_rows.value;
LAB_00b98a06:
    (pCVar19->dialect_options).skip_rows.set_by_user = false;
    (pCVar19->dialect_options).skip_rows.value = local_138;
  }
  else if (pCVar2->null_padding == false) goto LAB_00b98a06;
  (pCVar19->dialect_options).num_cols = local_158;
  this->lines_sniffed = this_01->result_position;
LAB_00b98d42:
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,std::default_delete<duckdb::ColumnCountScanner>,true>>>
              *)this_00,scanner);
  return;
}

Assistant:

void CSVSniffer::AnalyzeDialectCandidate(unique_ptr<ColumnCountScanner> scanner, idx_t &rows_read,
                                         idx_t &best_consistent_rows, idx_t &prev_padding_count,
                                         idx_t &min_ignored_rows) {
	// The sniffed_column_counts variable keeps track of the number of columns found for each row
	auto &sniffed_column_counts = scanner->ParseChunk();
	idx_t dirty_notes = 0;
	idx_t dirty_notes_minus_comments = 0;
	if (sniffed_column_counts.error) {
		if (!scanner->error_handler->HasError(MAXIMUM_LINE_SIZE)) {
			all_fail_max_line_size = false;
		} else {
			line_error = scanner->error_handler->GetFirstError(MAXIMUM_LINE_SIZE);
		}
		// This candidate has an error (i.e., over maximum line size or never unquoting quoted values)
		return;
	}
	all_fail_max_line_size = false;
	idx_t consistent_rows = 0;
	idx_t num_cols = sniffed_column_counts.result_position == 0 ? 1 : sniffed_column_counts[0].number_of_columns;
	const bool ignore_errors = options.ignore_errors.GetValue();
	// If we are ignoring errors and not null_padding , we pick the most frequent number of columns as the right one
	const bool use_most_frequent_columns = ignore_errors && !options.null_padding;
	if (use_most_frequent_columns) {
		num_cols = sniffed_column_counts.GetMostFrequentColumnCount();
	}
	idx_t padding_count = 0;
	idx_t comment_rows = 0;
	idx_t ignored_rows = 0;
	const bool allow_padding = options.null_padding;
	bool first_valid = false;
	if (sniffed_column_counts.result_position > rows_read) {
		rows_read = sniffed_column_counts.result_position;
	}
	if (set_columns.IsCandidateUnacceptable(num_cols, options.null_padding, ignore_errors,
	                                        sniffed_column_counts[0].last_value_always_empty)) {
		max_columns_found_error = num_cols > max_columns_found_error ? num_cols : max_columns_found_error;
		// Not acceptable
		return;
	}
	idx_t header_idx = 0;
	for (idx_t row = 0; row < sniffed_column_counts.result_position; row++) {
		if (set_columns.IsCandidateUnacceptable(sniffed_column_counts[row].number_of_columns, options.null_padding,
		                                        ignore_errors, sniffed_column_counts[row].last_value_always_empty)) {
			max_columns_found_error = sniffed_column_counts[row].number_of_columns > max_columns_found_error
			                              ? sniffed_column_counts[row].number_of_columns
			                              : max_columns_found_error;
			// Not acceptable
			return;
		}
		if (sniffed_column_counts[row].is_comment) {
			comment_rows++;
		} else if (sniffed_column_counts[row].last_value_always_empty &&
		           sniffed_column_counts[row].number_of_columns ==
		               sniffed_column_counts[header_idx].number_of_columns + 1) {
			// we allow for the first row to miss one column IF last_value_always_empty is true
			// This is so we can sniff files that have an extra delimiter on the data part.
			// e.g., C1|C2\n1|2|\n3|4|
			consistent_rows++;
		} else if (num_cols < sniffed_column_counts[row].number_of_columns &&
		           (!options.dialect_options.skip_rows.IsSetByUser() || comment_rows > 0) &&
		           (!set_columns.IsSet() || options.null_padding) && (!first_valid || (!use_most_frequent_columns))) {
			// all rows up to this point will need padding
			if (!first_valid) {
				first_valid = true;
				sniffed_column_counts.state_machine.dialect_options.rows_until_header = row;
			}
			padding_count = 0;
			// we use the maximum amount of num_cols that we find
			num_cols = sniffed_column_counts[row].number_of_columns;
			dirty_notes = row;
			dirty_notes_minus_comments = dirty_notes - comment_rows;
			header_idx = row;
			consistent_rows = 1;
		} else if (sniffed_column_counts[row].number_of_columns == num_cols || (use_most_frequent_columns)) {
			if (!first_valid) {
				first_valid = true;
				sniffed_column_counts.state_machine.dialect_options.rows_until_header = row;
				dirty_notes = row;
			}
			if (sniffed_column_counts[row].number_of_columns != num_cols) {
				ignored_rows++;
			}
			consistent_rows++;
		} else if (num_cols >= sniffed_column_counts[row].number_of_columns) {
			// we are missing some columns, we can parse this as long as we add padding
			padding_count++;
		}
	}

	if (sniffed_column_counts.state_machine.options.dialect_options.skip_rows.IsSetByUser()) {
		sniffed_column_counts.state_machine.dialect_options.rows_until_header +=
		    sniffed_column_counts.state_machine.options.dialect_options.skip_rows.GetValue();
	}
	// Calculate the total number of consistent rows after adding padding.
	consistent_rows += padding_count;

	// Whether there are more values (rows) available that are consistent, exceeding the current best.
	const bool more_values = consistent_rows > best_consistent_rows && num_cols >= max_columns_found;

	const bool more_columns = consistent_rows == best_consistent_rows && num_cols > max_columns_found;

	// If additional padding is required when compared to the previous padding count.
	const bool require_more_padding = padding_count > prev_padding_count;

	// If less padding is now required when compared to the previous padding count.
	const bool require_less_padding = padding_count < prev_padding_count;

	// If there was only a single column before, and the new number of columns exceeds that.
	const bool single_column_before = max_columns_found < 2 && num_cols > max_columns_found * candidates.size();

	// If the number of rows is consistent with the calculated value after accounting for skipped rows and the
	// start row.
	const bool rows_consistent =
	    consistent_rows + (dirty_notes_minus_comments - options.dialect_options.skip_rows.GetValue()) + comment_rows ==
	    sniffed_column_counts.result_position - options.dialect_options.skip_rows.GetValue();
	// If there are more than one consistent row.
	const bool more_than_one_row = consistent_rows > 1;

	// If there are more than one column.
	const bool more_than_one_column = num_cols > 1;

	// If the start position is valid.
	const bool start_good = !candidates.empty() &&
	                        dirty_notes <= candidates.front()->GetStateMachine().dialect_options.skip_rows.GetValue();

	// If padding happened but it is not allowed.
	const bool invalid_padding = !allow_padding && padding_count > 0;

	const bool comments_are_acceptable = AreCommentsAcceptable(
	    sniffed_column_counts, num_cols, options.dialect_options.state_machine_options.comment.IsSetByUser());

	const bool quoted =
	    scanner->ever_quoted &&
	    sniffed_column_counts.state_machine.dialect_options.state_machine_options.quote.GetValue() != '\0';

	// For our columns to match, we either don't have them manually set, or they match in value with the sniffed value
	const bool columns_match_set =
	    num_cols == set_columns.Size() ||
	    (num_cols == set_columns.Size() + 1 && sniffed_column_counts[0].last_value_always_empty) ||
	    !set_columns.IsSet();

	max_columns_found_error = num_cols > max_columns_found_error ? num_cols : max_columns_found_error;

	// If rows are consistent and no invalid padding happens, this is the best suitable candidate if one of the
	// following is valid:
	// - There's a single column before.
	// - There are more values and no additional padding is required.
	// - There's more than one column and less padding is required.
	if (columns_match_set && (rows_consistent || (set_columns.IsSet() && ignore_errors)) &&
	    (single_column_before || ((more_values || more_columns) && !require_more_padding) ||
	     (more_than_one_column && require_less_padding) || quoted) &&
	    !invalid_padding && comments_are_acceptable) {
		if (!candidates.empty() && set_columns.IsSet() && max_columns_found == set_columns.Size() &&
		    consistent_rows <= best_consistent_rows) {
			// We have a candidate that fits our requirements better
			if (candidates.front()->ever_quoted || !scanner->ever_quoted) {
				return;
			}
		}
		auto &sniffing_state_machine = scanner->GetStateMachine();

		if (!candidates.empty() && candidates.front()->ever_quoted) {
			// Give preference to quoted boys.
			if (!scanner->ever_quoted) {
				return;
			} else {
				// Give preference to one that got escaped
				if (!scanner->ever_escaped && candidates.front()->ever_escaped &&
				    sniffing_state_machine.dialect_options.state_machine_options.strict_mode.GetValue()) {
					return;
				}
				if (best_consistent_rows == consistent_rows && num_cols >= max_columns_found) {
					// If both have not been escaped, this might get solved later on.
					sniffing_state_machine.dialect_options.num_cols = num_cols;
					candidates.emplace_back(std::move(scanner));
					max_columns_found = num_cols;
					return;
				}
			}
		}
		if (max_columns_found == num_cols && (ignored_rows > min_ignored_rows)) {
			return;
		}
		if (max_columns_found > 1 && num_cols > max_columns_found && consistent_rows < best_consistent_rows / 2 &&
		    options.null_padding) {
			// When null_padding is true, we only give preference to a max number of columns if null padding is at least
			// 50% as consistent as the best case scenario
			return;
		}
		if (quoted && num_cols < max_columns_found) {
			if (scanner->ever_escaped &&
			    sniffing_state_machine.dialect_options.state_machine_options.strict_mode.GetValue()) {
				for (auto &candidate : candidates) {
					if (candidate->ever_quoted && candidate->ever_escaped) {
						return;
					}
				}

			} else {
				for (auto &candidate : candidates) {
					if (candidate->ever_quoted) {
						return;
					}
				}
			}
		}
		best_consistent_rows = consistent_rows;
		max_columns_found = num_cols;
		prev_padding_count = padding_count;
		min_ignored_rows = ignored_rows;

		if (options.dialect_options.skip_rows.IsSetByUser()) {
			// If skip rows is set by user, and we found dirty notes, we only accept it if either null_padding or
			// ignore_errors is set we have comments
			if (dirty_notes != 0 && !options.null_padding && !options.ignore_errors.GetValue() && comment_rows == 0) {
				return;
			}
			sniffing_state_machine.dialect_options.skip_rows = options.dialect_options.skip_rows.GetValue();
		} else if (!options.null_padding) {
			sniffing_state_machine.dialect_options.skip_rows = dirty_notes;
		}
		candidates.clear();
		sniffing_state_machine.dialect_options.num_cols = num_cols;
		lines_sniffed = sniffed_column_counts.result_position;
		candidates.emplace_back(std::move(scanner));
		return;
	}
	// If there's more than one row and column, the start is good, rows are consistent,
	// no additional padding is required, and there is no invalid padding, and there is not yet a candidate
	// with the same quote, we add this state_machine as a suitable candidate.
	if (columns_match_set && more_than_one_row && more_than_one_column && start_good && rows_consistent &&
	    !require_more_padding && !invalid_padding && num_cols == max_columns_found && comments_are_acceptable) {
		auto &sniffing_state_machine = scanner->GetStateMachine();

		if (options.dialect_options.skip_rows.IsSetByUser()) {
			// If skip rows is set by user, and we found dirty notes, we only accept it if either null_padding or
			// ignore_errors is set
			if (dirty_notes != 0 && !options.null_padding && !options.ignore_errors.GetValue()) {
				return;
			}
			sniffing_state_machine.dialect_options.skip_rows = options.dialect_options.skip_rows.GetValue();
		} else if (!options.null_padding) {
			sniffing_state_machine.dialect_options.skip_rows = dirty_notes;
		}
		sniffing_state_machine.dialect_options.num_cols = num_cols;
		lines_sniffed = sniffed_column_counts.result_position;
		candidates.emplace_back(std::move(scanner));
	}
}